

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::ImportClient::~ImportClient(ImportClient *this)

{
  ImportClient *this_local;
  
  ~ImportClient(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~ImportClient() noexcept(false) {
      unwindDetector.catchExceptionsIfUnwinding([&]() {
        // Remove self from the import table, if the table is still pointing at us.
        KJ_IF_SOME(import, connectionState->imports.find(importId)) {
          KJ_IF_SOME(i, import.importClient) {
            if (&i == this) {
              connectionState->imports.erase(importId);
            }
          }
        }

        // Send a message releasing our remote references.
        if (remoteRefcount > 0 && connectionState->connection.is<Connected>()) {
          auto message = connectionState->connection.get<Connected>().connection
              ->newOutgoingMessage(messageSizeHint<rpc::Release>());
          rpc::Release::Builder builder = message->getBody().initAs<rpc::Message>().initRelease();
          builder.setId(importId);
          builder.setReferenceCount(remoteRefcount);
          message->send();
        }

        connectionState->checkIfBecameIdle();
      });
    }